

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

void __thiscall ICM::DefFunc::Calc::Div::Div(Div *this)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(long_&,_const_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/source/runtime/deffunc.cpp:141:50)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(long_&,_const_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/source/runtime/deffunc.cpp:141:50)>
             ::_M_manager;
  (this->super_NumCall).super_FI._vptr_FuncInitObject = (_func_int **)&PTR_sign_00152308;
  std::function<void_(long_&,_const_long_&)>::function
            (&(this->super_NumCall).fp,(function<void_(long_&,_const_long_&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  (this->super_NumCall).super_FI._vptr_FuncInitObject = (_func_int **)&PTR_sign_001523c0;
  return;
}

Assistant:

Mul() : NumCall([](N &n1, const N &n2) { n1 *= n2; }) {}